

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O2

void __thiscall
Assimp::Q3BSPFileImporter::CreateNodes
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,aiNode *pParent)

{
  vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *faceArray;
  aiNode *paVar1;
  aiScene *paVar2;
  size_t i;
  size_t sVar3;
  Q3BSPFileImporter *pQVar4;
  aiMesh **ppaVar5;
  ulong uVar6;
  aiNode **ppaVar7;
  Q3BSPFileImporter *this_00;
  uint uVar8;
  pointer ppaVar9;
  pointer ppaVar10;
  aiMesh *pMesh;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> MeshArray;
  vector<aiNode_*,_std::allocator<aiNode_*>_> NodeArray;
  aiNode *pNode;
  aiMesh *local_90;
  _Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_> local_88;
  _Vector_base<aiNode_*,_std::allocator<aiNode_*>_> local_68;
  aiScene *local_48;
  Q3BSPModel *local_40;
  aiNode *local_38;
  
  if (pModel != (Q3BSPModel *)0x0) {
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar8 = 0;
    this_00 = this;
    local_48 = pScene;
    local_40 = pModel;
    for (pQVar4 = (Q3BSPFileImporter *)
                  (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        paVar2 = local_48, ppaVar10 = local_88._M_impl.super__Vector_impl_data._M_finish,
        ppaVar9 = local_88._M_impl.super__Vector_impl_data._M_start,
        pQVar4 != (Q3BSPFileImporter *)
                  &(this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header;
        pQVar4 = (Q3BSPFileImporter *)std::_Rb_tree_increment((_Rb_tree_node_base *)pQVar4)) {
      faceArray = (vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                   *)(pQVar4->super_BaseImporter).importerScale;
      sVar3 = countData(this_00,faceArray);
      if (sVar3 != 0) {
        local_90 = (aiMesh *)0x0;
        local_38 = CreateTopology(this,local_40,uVar8,faceArray,&local_90);
        if (local_38 != (aiNode *)0x0) {
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                    ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)&local_68,&local_38);
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&local_88,&local_90);
        }
      }
      uVar8 = uVar8 + 1;
      this_00 = pQVar4;
    }
    uVar8 = (uint)((ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_88._M_impl.super__Vector_impl_data._M_start) >> 3);
    local_48->mNumMeshes = uVar8;
    if (uVar8 == 0) {
      uVar8 = 0;
    }
    else {
      ppaVar5 = (aiMesh **)
                operator_new__((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_88._M_impl.super__Vector_impl_data._M_start & 0x7fffffff8
                              );
      paVar2->mMeshes = ppaVar5;
      for (uVar6 = 0; uVar6 < (ulong)((long)ppaVar10 - (long)ppaVar9 >> 3); uVar6 = uVar6 + 1) {
        if (ppaVar9[uVar6] != (aiMesh *)0x0) {
          paVar2->mMeshes[uVar6] = ppaVar9[uVar6];
          ppaVar9 = local_88._M_impl.super__Vector_impl_data._M_start;
          ppaVar10 = local_88._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      uVar8 = (uint)((ulong)((long)ppaVar10 - (long)ppaVar9) >> 3);
    }
    pParent->mNumChildren = uVar8;
    ppaVar7 = (aiNode **)operator_new__((ulong)paVar2->mRootNode->mNumChildren << 3);
    pParent->mChildren = ppaVar7;
    for (uVar6 = 0;
        uVar6 < (ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_68._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar6 = uVar6 + 1) {
      paVar1 = local_68._M_impl.super__Vector_impl_data._M_start[uVar6];
      paVar1->mParent = pParent;
      pParent->mChildren[uVar6] = paVar1;
      *pParent->mChildren[uVar6]->mMeshes = (uint)uVar6;
    }
    std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base(&local_68);
    std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base(&local_88);
  }
  return;
}

Assistant:

void Q3BSPFileImporter::CreateNodes( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
        aiNode *pParent ) {
    if ( nullptr == pModel ) {
        return;
    }

    unsigned int matIdx( 0 );
    std::vector<aiMesh*> MeshArray;
    std::vector<aiNode*> NodeArray;
    for ( FaceMapIt it = m_MaterialLookupMap.begin(); it != m_MaterialLookupMap.end(); ++it ) {
        std::vector<Q3BSP::sQ3BSPFace*> *pArray = (*it).second;
        size_t numVerts = countData( *pArray );
        if ( 0 != numVerts ) {
            aiMesh *pMesh( nullptr );
            aiNode *pNode = CreateTopology( pModel, matIdx, *pArray, &pMesh );
            if ( nullptr != pNode ) {
                NodeArray.push_back( pNode );
                MeshArray.push_back( pMesh );
            }
        }
        matIdx++;
    }

    pScene->mNumMeshes = static_cast<unsigned int>( MeshArray.size() );
    if ( pScene->mNumMeshes > 0 ) {
        pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ];
        for ( size_t i = 0; i < MeshArray.size(); i++ ) {
            aiMesh *pMesh = MeshArray[ i ];
            if ( nullptr != pMesh ) {
                pScene->mMeshes[ i ] = pMesh;
            }
        }
    }

    pParent->mNumChildren = static_cast<unsigned int>(MeshArray.size());
    pParent->mChildren = new aiNode*[ pScene->mRootNode->mNumChildren ];
    for ( size_t i=0; i<NodeArray.size(); i++ ) {
        aiNode *pNode = NodeArray[ i ];
        pNode->mParent = pParent;
        pParent->mChildren[ i ] = pNode;
        pParent->mChildren[ i ]->mMeshes[ 0 ] = static_cast<unsigned int>(i);
    }
}